

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O0

QDataStream * __thiscall QDataStream::operator<<(QDataStream *this,qint64 i)

{
  int iVar1;
  ssize_t sVar2;
  size_t in_RCX;
  longlong in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  quint32 i2;
  quint32 i1;
  undefined8 in_stack_ffffffffffffffc8;
  quint32 i_00;
  QDataStream *local_18;
  longlong local_10;
  long local_8;
  
  i_00 = (quint32)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = in_RDI;
  local_10 = in_RSI;
  if ((in_RDI->dev != (QIODevice *)0x0) && (in_RDI->q_status == '\0')) {
    iVar1 = version(in_RDI);
    if (iVar1 < 6) {
      operator<<(in_RDI,i_00);
      operator<<(in_RDI,i_00);
      local_18 = in_RDI;
    }
    else {
      if ((in_RDI->noswap & 1U) == 0) {
        local_10 = qbswap<long_long,void>(0x485bcd);
      }
      sVar2 = QIODevice::write(in_RDI->dev,(int)&local_10,(void *)0x8,in_RCX);
      local_18 = in_RDI;
      if (sVar2 != 8) {
        in_RDI->q_status = '\x03';
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

QDataStream &QDataStream::operator<<(qint64 i)
{
    CHECK_STREAM_WRITE_PRECOND(*this)
    if (version() < 6) {
        quint32 i1 = i & 0xffffffff;
        quint32 i2 = i >> 32;
        *this << i2 << i1;
    } else {
        if (!noswap) {
            i = qbswap(i);
        }
        if (dev->write((char *)&i, sizeof(qint64)) != sizeof(qint64))
            q_status = WriteFailed;
    }
    return *this;
}